

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O0

size_t __thiscall
google::protobuf::internal::
MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
::ByteSizeLong(MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
               *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long local_30;
  long local_28;
  size_t size;
  MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
  *this_local;
  
  bVar1 = has_key(this);
  if (bVar1) {
    iVar2 = (*(this->super_MessageLite)._vptr_MessageLite[0x11])();
    iVar2 = MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)3,_long>::ByteSize
                      ((MapEntryAccessorType *)CONCAT44(extraout_var,iVar2));
    local_28 = (long)iVar2 + 1;
  }
  else {
    local_28 = 0;
  }
  bVar1 = has_value(this);
  if (bVar1) {
    iVar2 = (*(this->super_MessageLite)._vptr_MessageLite[0x12])();
    iVar2 = MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)1,_double>::
            ByteSize((MapEntryAccessorType *)CONCAT44(extraout_var_00,iVar2));
    local_30 = (long)iVar2 + 1;
  }
  else {
    local_30 = 0;
  }
  return local_30 + local_28;
}

Assistant:

size_t ByteSizeLong() const {
    size_t size = 0;
    size += has_key() ? kTagSize + KeyTypeHandler::ByteSize(key()) : 0;
    size += has_value() ? kTagSize + ValueTypeHandler::ByteSize(value()) : 0;
    return size;
  }